

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O2

iterator __thiscall
eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::insert
          (vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *this,iterator pos,
          value_type *val)

{
  pair<char,_int> *ppVar1;
  value_type *pvVar2;
  iterator ppVar3;
  pair<eastl::pair<char,_int>_*,_bool> pVar4;
  
  if (((this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpBegin == pos) ||
     (pos[-1].first < val->first)) {
    if ((this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd == pos) {
      ppVar1 = (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpBegin;
      pvVar2 = (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd;
      if ((pvVar2 == pos) &&
         (pvVar2 != (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.
                    mpCapacity)) {
        (this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.mpEnd = pvVar2 + 1
        ;
        *pvVar2 = *val;
      }
      else {
        vector<eastl::pair<char,_int>,_eastl::allocator>::DoInsertValue(&this->m_base,pos,val);
      }
      return (iterator)
             ((long)pos +
             ((long)(this->m_base).super_VectorBase<eastl::pair<char,_int>,_eastl::allocator>.
                    mpBegin - (long)ppVar1));
    }
    if (val->first < pos->first) {
      ppVar3 = vector<eastl::pair<char,_int>,_eastl::allocator>::insert(&this->m_base,pos,val);
      return ppVar3;
    }
  }
  pVar4 = insert(this,val);
  return pVar4.first;
}

Assistant:

iterator insert(iterator const pos, value_type const& val) {
    return
        ((pos == begin() || m_cmp(*(pos-1), val)) &&
         (pos ==   end() || m_cmp(val, *pos)))
        ? m_base.insert(pos, val)
        : insert(val).first
        ;
  }